

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

void __thiscall ON_SubD::SubDModifiedNofification(ON_SubD *this)

{
  ON_SubD *this_local;
  
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x17])();
  UpdateAllTagsAndSectorCoefficients(this,false);
  return;
}

Assistant:

void ON_SubD::SubDModifiedNofification()
{
  // DestroyRuntimeCache() 
  // Clears
  //  Saved subdivision points.
  //  Saved limit surface information.
  //  Bounding boxes.
  //  
  DestroyRuntimeCache();

  // This is a heavy handed tag update.
  UpdateAllTagsAndSectorCoefficients(false);
}